

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O2

string * MakeAbsolutePath_abi_cxx11_(string *__return_storage_ptr__,char *in)

{
  char *__ptr;
  Logger *this;
  allocator local_1d1;
  string local_1d0 [32];
  char *local_1b0 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __ptr = realpath(in,(char *)0x0);
  if (__ptr == (char *)0x0) {
    this = Assimp::DefaultLogger::get();
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[15]>(&local_190,(char (*) [15])"Invalid path: ");
    std::__cxx11::string::string(local_1d0,in,&local_1d1);
    std::operator<<((ostream *)&local_190,local_1d0);
    std::__cxx11::stringbuf::str();
    Assimp::Logger::warn(this,local_1b0[0]);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static std::string MakeAbsolutePath(const char* in)
{
    ai_assert(in);
    std::string out;
#ifdef _WIN32
    wchar_t* ret = ::_wfullpath(nullptr, Utf8ToWide(in).c_str(), 0);
    if (ret) {
        out = WideToUtf8(ret);
        free(ret);
    }
#else
    char* ret = realpath(in, nullptr);
    if (ret) {
        out = ret;
        free(ret);
    }
#endif
    if (!ret) {
        // preserve the input path, maybe someone else is able to fix
        // the path before it is accessed (e.g. our file system filter)
        ASSIMP_LOG_WARN_F("Invalid path: ", std::string(in));
        out = in;
    }
    return out;
}